

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall
cmOrderDirectoriesConstraint::FindImplicitConflicts
          (cmOrderDirectoriesConstraint *this,ostringstream *w)

{
  string *path;
  size_t __n;
  bool bVar1;
  char cVar2;
  int iVar3;
  pointer pbVar4;
  ostream *poVar5;
  bool bVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  string local_70;
  string local_50;
  
  pbVar4 = (this->OD->OriginalDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->OD->OriginalDirectories).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    bVar6 = true;
    uVar7 = 0;
    uVar9 = 1;
    do {
      path = pbVar4 + uVar7;
      __n = pbVar4[uVar7]._M_string_length;
      if (__n == (this->Directory)._M_string_length) {
        if (__n != 0) {
          iVar3 = bcmp((path->_M_dataplus)._M_p,(this->Directory)._M_dataplus._M_p,__n);
          if (iVar3 != 0) goto LAB_004238f4;
        }
      }
      else {
LAB_004238f4:
        cmsys::SystemTools::GetRealPath(&local_50,path,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_70,&this->Directory,(string *)0x0);
        _Var8._M_p = local_70._M_dataplus._M_p;
        if (local_50._M_string_length == local_70._M_string_length) {
          if (local_50._M_string_length != 0) {
            iVar3 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                         local_50._M_string_length);
            if (iVar3 != 0) goto LAB_0042393b;
          }
          cVar2 = '\0';
        }
        else {
LAB_0042393b:
          iVar3 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,path);
          cVar2 = (char)iVar3;
          _Var8._M_p = local_70._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var8._M_p != &local_70.field_2) {
          operator_delete(_Var8._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (cVar2 != '\0') {
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)w,"  ",2);
            (*this->_vptr_cmOrderDirectoriesConstraint[2])(this,w);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)w," in ",4);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)w,(this->Directory)._M_dataplus._M_p,
                                (this->Directory)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," may be hidden by files in:\n",0x1c);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)w,"    ",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)w,(path->_M_dataplus)._M_p,path->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          bVar6 = false;
        }
      }
      pbVar4 = (this->OD->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar9 < (ulong)((long)(this->OD->OriginalDirectories).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5);
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void FindImplicitConflicts(std::ostringstream& w)
  {
    bool first = true;
    for (unsigned int i = 0; i < this->OD->OriginalDirectories.size(); ++i) {
      // Check if this directory conflicts with the entry.
      std::string const& dir = this->OD->OriginalDirectories[i];
      if (dir != this->Directory &&
          cmSystemTools::GetRealPath(dir) !=
            cmSystemTools::GetRealPath(this->Directory) &&
          this->FindConflict(dir)) {
        // The library will be found in this directory but it is
        // supposed to be found in an implicit search directory.
        if (first) {
          first = false;
          w << "  ";
          this->Report(w);
          w << " in " << this->Directory << " may be hidden by files in:\n";
        }
        w << "    " << dir << "\n";
      }
    }
  }